

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O3

void sum_cols_int(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  long lVar3;
  AssertionHandler catchAssertionHandler;
  int local_dc;
  sqlite3_context *local_d8;
  undefined4 local_cc;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  int *local_a8;
  char *local_a0;
  size_t sStack_98;
  undefined4 *local_90;
  AssertionHandler local_88;
  StringRef local_40;
  
  local_b8._vptr_ITransientExpression = (_func_int **)0x182431;
  local_b8.m_isBinaryExpression = true;
  local_b8.m_result = false;
  local_b8._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_c8.line = 0xf;
  local_dc = argc;
  local_d8 = context;
  Catch::StringRef::StringRef(&local_40,"argc > 0");
  Catch::AssertionHandler::AssertionHandler
            (&local_88,(StringRef *)&local_b8,&local_c8,local_40,Normal);
  local_cc = 0;
  Catch::StringRef::StringRef((StringRef *)&local_c8,">");
  local_b8.m_result = 0 < argc;
  local_b8.m_isBinaryExpression = true;
  local_b8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001b2c68;
  local_a8 = &local_dc;
  local_a0 = local_c8.file;
  sStack_98 = local_c8.line;
  local_90 = &local_cc;
  Catch::AssertionHandler::handleExpr(&local_88,&local_b8);
  Catch::ITransientExpression::~ITransientExpression(&local_b8);
  Catch::AssertionHandler::complete(&local_88);
  if (local_88.m_completed == false) {
    (*(local_88.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  iVar1 = duckdb_shell_sqlite3_value_int(*argv);
  if (1 < local_dc) {
    lVar3 = 1;
    do {
      iVar2 = duckdb_shell_sqlite3_value_int(argv[lVar3]);
      iVar1 = iVar1 + iVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < local_dc);
  }
  duckdb_shell_sqlite3_result_int(local_d8,iVar1);
  return;
}

Assistant:

static void sum_cols_int(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc > 0);
	auto sum = sqlite3_value_int(argv[0]);
	for (int i = 1; i < argc; ++i) {
		sum += sqlite3_value_int(argv[i]);
	}
	sqlite3_result_int(context, sum);
}